

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.h
# Opt level: O1

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestStartCommand::Clone(cmCTestStartCommand *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  
  pp_Var1 = (_func_int **)operator_new(0x30);
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__cmCommand_0095fba8;
  *(undefined2 *)(pp_Var1 + 5) = 1;
  pp_Var1[3] = *(_func_int **)(in_RSI + 0x18);
  pp_Var1[4] = *(_func_int **)(in_RSI + 0x20);
  *(undefined1 *)(pp_Var1 + 5) = *(undefined1 *)(in_RSI + 0x28);
  *(undefined1 *)((long)pp_Var1 + 0x29) = *(undefined1 *)(in_RSI + 0x29);
  (this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand = pp_Var1;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestStartCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    ni->CreateNewTag = this->CreateNewTag;
    ni->Quiet = this->Quiet;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }